

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

Clause * __thiscall LinearGE<1,_0>::explain(LinearGE<1,_0> *this,Lit param_1,int inf_id)

{
  uint uVar1;
  uint uVar2;
  Lit *pLVar3;
  int iVar4;
  Clause *this_00;
  size_t __size;
  long lVar5;
  ulong uVar6;
  Clause *c;
  Clause *local_38;
  
  uVar1 = (this->x).sz;
  uVar2 = (this->y).sz;
  if (uVar1 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      iVar4 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar5) + 0x48))();
      (this->ps).data[uVar6].x = iVar4;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (this->x).sz);
  }
  if ((this->y).sz != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      iVar4 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar5) + 0x40))();
      (this->ps).data[(this->x).sz + (int)uVar6].x = iVar4;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (this->y).sz);
  }
  uVar6 = 0xffffffff;
  if (uVar2 + uVar1 != inf_id) {
    uVar6 = (ulong)(uint)inf_id;
  }
  pLVar3 = (this->ps).data;
  pLVar3[uVar6].x = pLVar3->x;
  uVar1 = (this->ps).sz;
  __size = 8;
  if (uVar1 != 0) {
    __size = (ulong)(uVar1 - 1) * 4 + 8;
  }
  this_00 = (Clause *)malloc(__size);
  Clause::Clause<vec<Lit>>(this_00,&this->ps,false);
  *(byte *)this_00 = *(byte *)this_00 | 2;
  local_38 = this_00;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
  return local_38;
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		if (inf_id == static_cast<int>(x.size() + y.size())) {
			inf_id = -1;
		}
		if ((R != 0) && r.isFixed()) {
			ps[0] = r.getValLit();
		}
		for (unsigned int i = 0; i < x.size(); i++) {
			ps[i + R] = x[i].getMaxLit();
		}
		for (unsigned int i = 0; i < y.size(); i++) {
			ps[i + R + x.size()] = y[i].getMaxLit();
		}
		ps[R + inf_id] = ps[0];
		return Reason_new(ps);
	}